

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_0::Monomorphize::run(Monomorphize *this,Module *module)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  pointer *this_00;
  char **this_01;
  __node_base_ptr *pp_Var2;
  undefined8 *puVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  PassRunner *pPVar6;
  _func_int **pp_Var7;
  _func_int *p_Var8;
  _func_int **pp_Var9;
  ArenaVector<wasm::Expression_*> *pAVar10;
  Expression *pEVar11;
  pointer puVar12;
  EVP_PKEY_CTX *dst;
  _func_int *p_Var13;
  undefined1 uVar14;
  undefined1 uVar15;
  pointer pNVar16;
  undefined4 uVar17;
  Iterator IVar18;
  undefined8 uVar19;
  _Base_ptr p_Var20;
  pointer ppEVar21;
  float fVar22;
  __node_base out;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> func;
  bool bVar23;
  Index IVar24;
  uint uVar25;
  int iVar26;
  unsigned_long uVar27;
  unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
  *this_02;
  Function *pFVar28;
  mapped_type *pmVar29;
  Module *pMVar30;
  undefined1 auVar31 [8];
  Expression **ppEVar32;
  size_type sVar33;
  ulong uVar34;
  __hash_code __c;
  __node_ptr p_Var35;
  Type *pTVar36;
  size_t sVar37;
  size_t sVar38;
  size_t sVar39;
  Type TVar40;
  Index *pIVar41;
  mapped_type *pmVar42;
  mapped_type *pmVar43;
  float *pfVar44;
  undefined4 extraout_var;
  LocalSet *pLVar45;
  Block *pBVar46;
  mapped_type *pmVar47;
  undefined1 auVar48 [8];
  Module *this_03;
  _func_int *p_Var49;
  AbstractChildIterator<wasm::ChildIterator> *pAVar50;
  code *pcVar51;
  char *pcVar52;
  ulong extraout_RDX;
  pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *__k;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *in_R8;
  Module *in_R9;
  long lVar53;
  _Head_base<0UL,_wasm::Function_*,_false> _Var54;
  undefined1 auVar55 [8];
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  undefined8 *puVar56;
  Iterator IVar57;
  Signature SVar58;
  Name NVar59;
  Name newTarget;
  Name newName;
  optional<wasm::Type> type;
  Name newTarget_00;
  undefined1 auStack_6b8 [8];
  CallFinder callFinder;
  undefined1 local_5c0 [8];
  ReturnCallersMap returnCallersMap;
  Expression *operand;
  undefined8 local_578;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_560;
  long local_548;
  long local_518;
  long local_460;
  undefined1 auStack_428 [8];
  Lister lister;
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  immovable;
  undefined1 auStack_2f8 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 auStack_298 [8];
  EffectAnalyzer nonMovingEffects;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> newOperands;
  undefined1 local_118 [8];
  Iterator __begin2_1;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_f0;
  _Base_ptr local_d8;
  __node_base local_d0;
  Builder builder;
  undefined1 auStack_b8 [8];
  Name target;
  Expression *child;
  uint local_8c;
  undefined1 auStack_88 [8];
  CallContext context;
  Builder local_50;
  Expression *curr;
  __node_base local_40;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> monoFunc;
  
  curr = (Expression *)module;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&returnCallersMap._M_h._M_single_bucket,"monomorphize-min-benefit",
             (allocator<char> *)auStack_6b8);
  std::__cxx11::to_string((string *)auStack_428,wasm::(anonymous_namespace)::MinPercentBenefit);
  Pass::getArgumentOrDefault
            ((string *)auStack_298,&this->super_Pass,
             (string *)&returnCallersMap._M_h._M_single_bucket,(string *)auStack_428);
  uVar27 = std::__cxx11::stoul((string *)auStack_298,(size_t *)0x0,10);
  wasm::(anonymous_namespace)::MinPercentBenefit = (uint)uVar27;
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::~string((string *)auStack_428);
  std::__cxx11::string::~string((string *)&returnCallersMap._M_h._M_single_bucket);
  pEVar11 = curr;
  ReturnUtils::findReturnCallers
            ((unordered_map<wasm::Function_*,_bool,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
              *)local_5c0,(Module *)curr);
  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_2f8 = (undefined1  [8])0x0;
  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  puVar3 = *(undefined8 **)(pEVar11 + 2);
  for (puVar56 = (undefined8 *)pEVar11[1].type.id;
      pNVar16 = funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start, puVar56 != puVar3; puVar56 = puVar56 + 1) {
    if (((value_type *)*puVar56)[2].super_IString.str._M_len == 0) {
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_2f8,
                 (value_type *)*puVar56);
    }
  }
  local_d8 = (_Base_ptr)&nonMovingEffects.globalsWritten;
  this_02 = &this->funcContextMap;
  this_00 = &lister.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this_01 = &target.super_IString.str._M_str;
  auVar48 = auStack_2f8;
  do {
    if (auVar48 == (undefined1  [8])pNVar16) {
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_2f8);
      std::
      _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_5c0);
      return;
    }
    p_Var4 = (_func_int *)(((pointer)auVar48)->super_IString).str._M_str;
    pFVar28 = Module::getFunction((Module *)curr,(Name)(((pointer)auVar48)->super_IString).str);
    auStack_6b8 = (undefined1  [8])0x0;
    callFinder.
    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .replacep = (Expression **)0x0;
    callFinder.infos.
    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    callFinder.infos.
    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    callFinder.
    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .currFunction = (Function *)0x0;
    callFinder.
    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .currModule = (Module *)0x0;
    callFinder.
    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    callFinder.
    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    callFinder.
    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    callFinder.
    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                *)auStack_6b8,
               PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
               ::scan,&pFVar28->body);
    while (this_03 = callFinder.
                     super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                     .currModule,
          ((long)callFinder.
                 super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)callFinder.
                 super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .stack.fixed._M_elems[9].currp >> 4) +
          (long)callFinder.
                super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                .replacep != 0) {
      if ((pointer)callFinder.
                   super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          callFinder.
          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (callFinder.
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .replacep == (Expression **)0x0) {
          pcVar52 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::Task, N = 10]"
          ;
LAB_00aa98db:
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,pcVar52);
        }
        ppEVar32 = callFinder.
                   super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .stack.fixed._M_elems
                   [(long)callFinder.
                          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                          .replacep + -2].currp;
        auStack_6b8 = (undefined1  [8])
                      callFinder.
                      super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                      .stack.fixed._M_elems
                      [(long)callFinder.
                             super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                             .replacep + -1].func;
        callFinder.
        super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
        .replacep = (Expression **)
                    ((long)callFinder.
                           super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                           .replacep + -1);
      }
      else {
        ppEVar32 = (Expression **)
                   callFinder.
                   super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .stack.flexible.
                   super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_6b8 = (undefined1  [8])
                      callFinder.
                      super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        callFinder.
        super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             callFinder.
             super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_6b8 == (Expression *)0x0) {
        pcVar52 = 
        "void wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::CallFinder, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::CallFinder>]"
        ;
LAB_00aa98bc:
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,pcVar52);
      }
      (*(code *)ppEVar32)((CallFinder *)auStack_6b8,(Expression **)auStack_6b8);
    }
    while( true ) {
      if (this_03 ==
          (Module *)
          callFinder.infos.
          super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
          ._M_impl.super__Vector_impl_data._M_start) break;
      pp_Var5 = ((Pass *)&this_03->exports)->_vptr_Pass;
      if ((pp_Var5[1] != (_func_int *)0x1) && (pp_Var5[7] != p_Var4)) {
        NVar59.super_IString.str._M_str = (char *)pp_Var5[7];
        NVar59.super_IString.str._M_len = (size_t)pp_Var5[6];
        pFVar28 = Module::getFunction((Module *)curr,NVar59);
        auStack_298 = (undefined1  [8])pFVar28;
        pmVar29 = std::__detail::
                  _Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_5c0,(key_type *)auStack_298);
        if (*pmVar29 == true) {
          ((Pass *)&this_03->exports)->runner = (PassRunner *)0x0;
        }
        pp_Var5 = ((Pass *)&this_03->exports)->_vptr_Pass;
        auStack_b8 = *(undefined1 (*) [8])&((IString *)(pp_Var5 + 6))->str;
        p_Var13 = pp_Var5[7];
        target.super_IString.str._M_len = (size_t)p_Var13;
        pMVar30 = (Module *)
                  Module::getFunction((Module *)curr,(Name)((IString *)(pp_Var5 + 6))->str);
        if ((pMVar30->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
          context.operands.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_88 = (undefined1  [8])0x0;
          context.operands.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          pPVar6 = (this->super_Pass).runner;
          local_d0._M_nxt = (_Hash_node_base *)curr;
          auStack_428 = (undefined1  [8])0x0;
          lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.replacep =
               (Expression **)0x0;
          lister.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          lister.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currFunction =
               (Function *)0x0;
          lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule =
               (Module *)0x0;
          lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems
          [9].currp = (Expression **)0x0;
          lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_40._M_nxt = (_Hash_node_base *)pMVar30;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::reserve
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                      .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                      currModule,0);
          pp_Var7 = ((Pass *)&this_03->exports)->_vptr_Pass;
          pp_Var9 = pp_Var7 + 2;
          nonMovingEffects.ignoreImplicitTraps = false;
          nonMovingEffects.trapsNeverHappen = false;
          nonMovingEffects._2_6_ = 0;
          auStack_298 = (undefined1  [8])pp_Var9;
          builder.wasm = (Module *)&pPVar6->options;
          p_Var8 = pp_Var7[3];
          p_Var49 = (_func_int *)0x0;
          auVar31 = (undefined1  [8])pp_Var9;
          while ((IVar18 = (Iterator)_auStack_298, p_Var49 != p_Var8 ||
                 (auVar31 != (undefined1  [8])pp_Var9))) {
            ppEVar32 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       Iterator::operator*((Iterator *)auStack_298);
            returnCallersMap._M_h._M_single_bucket = (__node_base_ptr)*ppEVar32;
            if (((long)lister.
                       super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                       super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                       flexible.
                       super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                 (long)lister.
                       super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                       super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                       fixed._M_elems[9].currp >> 4) +
                (long)lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                      .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.replacep
                != 0) {
              __assert_fail("stack.size() == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                            ,0x12d,
                            "void wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::walk(Expression *&) [SubType = Lister, VisitorType = wasm::UnifiedExpressionVisitor<Lister>]"
                           );
            }
            Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::pushTask
                      ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)auStack_428,
                       PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::scan,
                       (Expression **)&returnCallersMap._M_h._M_single_bucket);
            while (((long)lister.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)lister.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                          fixed._M_elems[9].currp >> 4) +
                   (long)lister.
                         super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                         super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                         replacep != 0) {
              if ((pointer)lister.
                           super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                           super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack
                           .fixed._M_elems[9].currp ==
                  lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible
                  .
                  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                if (lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.replacep ==
                    (Expression **)0x0) {
                  pcVar52 = 
                  "T &wasm::SmallVector<wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::Task, 10>::back() [T = wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::Task, N = 10]"
                  ;
                  goto LAB_00aa98db;
                }
                ppEVar32 = lister.
                           super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                           super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack
                           .fixed._M_elems
                           [(long)lister.
                                  super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                  .
                                  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                  .replacep + -2].currp;
                auStack_428 = (undefined1  [8])
                              lister.
                              super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                              .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                              stack.fixed._M_elems
                              [(long)lister.
                                     super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                     .
                                     super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                     .replacep + -1].func;
                lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.replacep =
                     (Expression **)
                     ((long)lister.
                            super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            replacep + -1);
              }
              else {
                ppEVar32 = (Expression **)
                           lister.
                           super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                           super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack
                           .flexible.
                           super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].func;
                auStack_428 = (undefined1  [8])
                              lister.
                              super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                              .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                              stack.flexible.
                              super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].currp;
                lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                     super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                     flexible.
                     super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1;
              }
              if (*(Expression **)auStack_428 == (Expression *)0x0) {
                pcVar52 = 
                "void wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::walk(Expression *&) [SubType = Lister, VisitorType = wasm::UnifiedExpressionVisitor<Lister>]"
                ;
                goto LAB_00aa98bc;
              }
              (*(code *)ppEVar32)((Lister *)auStack_428,(Expression **)auStack_428);
            }
            p_Var49 = (_func_int *)(nonMovingEffects._0_8_ + 1);
            nonMovingEffects._0_8_ = p_Var49;
            auVar31 = auStack_298;
          }
          lister.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)&immovable._M_h._M_rehash_policy._M_next_resize;
          immovable._M_h._M_buckets = (__buckets_ptr)0x1;
          immovable._M_h._M_bucket_count = 0;
          immovable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          immovable._M_h._M_element_count._0_4_ = 0x3f800000;
          immovable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          immovable._M_h._M_rehash_policy._4_4_ = 0;
          immovable._M_h._M_rehash_policy._M_next_resize = 0;
          uVar14 = (pPVar6->options).ignoreImplicitTraps;
          uVar15 = (pPVar6->options).trapsNeverHappen;
          auStack_298[1] = uVar15;
          auStack_298[0] = uVar14;
          stack0xfffffffffffffd6a = IVar18._2_14_;
          nonMovingEffects._0_8_ = curr;
          nonMovingEffects.module._0_4_ = (undefined4)curr[0x17].type.id;
          nonMovingEffects.module._4_2_ = 0;
          nonMovingEffects.localsRead._M_t._M_impl._0_4_ = 0;
          nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&nonMovingEffects.localsRead;
          nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          nonMovingEffects.localsWritten._M_t._M_impl._0_4_ = 0;
          nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&nonMovingEffects.localsWritten;
          nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          nonMovingEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
          nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color
               = _S_red;
          nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
          ;
          nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
               = (_Base_ptr)&nonMovingEffects.mutableGlobalsRead;
          nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right
               = (_Base_ptr)0x0;
          nonMovingEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
          nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_d8;
          nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_d8;
          nonMovingEffects.breakTargets._M_t._M_impl._0_4_ = 0;
          nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          nonMovingEffects.readsMemory = false;
          nonMovingEffects.writesMemory = false;
          nonMovingEffects.readsTable = false;
          nonMovingEffects.writesTable = false;
          nonMovingEffects.trap = false;
          nonMovingEffects.implicitTrap = false;
          nonMovingEffects.isAtomic = false;
          nonMovingEffects.throws_ = false;
          nonMovingEffects._228_4_ = 0;
          nonMovingEffects.tryDepth._0_7_ = 0;
          nonMovingEffects._239_4_ = 0;
          nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&nonMovingEffects.breakTargets;
          nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          nonMovingEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
          nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&nonMovingEffects.delegateTargets;
          nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          lVar53 = (long)lister.list.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                   (long)lister.
                         super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                         super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                         currModule >> 3;
          nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
          nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
LAB_00aa8d5f:
          if (0 < lVar53) {
            lVar53 = lVar53 + -1;
            local_50.wasm =
                 *(Module **)
                  ((long)lister.
                         super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                         super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                         currModule + lVar53 * 8);
            sVar33 = std::
                     _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)this_00,(key_type *)&local_50);
            if (sVar33 == 0) {
              pp_Var2 = &returnCallersMap._M_h._M_single_bucket;
              ShallowEffectAnalyzer::ShallowEffectAnalyzer
                        ((ShallowEffectAnalyzer *)pp_Var2,(PassOptions *)builder.wasm,(Module *)curr
                         ,(Expression *)local_50.wasm);
              bVar23 = EffectAnalyzer::invalidates
                                 ((EffectAnalyzer *)pp_Var2,(EffectAnalyzer *)auStack_298);
              if (((((!bVar23) && (local_578._4_1_ == '\0')) && (local_460 == 0)) &&
                  ((local_548 + local_518 == 0 && (local_578._5_1_ == '\0')))) &&
                 ((uVar34 = (ulong)*(Id *)&((local_50.wasm)->exports).
                                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start, 0x35 < uVar34
                  || ((0x3000000000000eU >> (uVar34 & 0x3f) & 1) == 0)))) {
                AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                          ((AbstractChildIterator<wasm::ChildIterator> *)local_118,
                           (Expression *)local_50.wasm);
                child = (Expression *)0x0;
                target.super_IString.str._M_str = (char *)local_118;
                IVar57 = AbstractChildIterator<wasm::ChildIterator>::end
                                   ((AbstractChildIterator<wasm::ChildIterator> *)local_118);
                uVar25 = 0;
                pAVar50 = (AbstractChildIterator<wasm::ChildIterator> *)local_118;
                while( true ) {
                  if ((uVar25 == IVar57.index) && (pAVar50 == IVar57.parent)) {
                    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
                    ~_Vector_base(&local_f0);
                    EffectAnalyzer::~EffectAnalyzer
                              ((EffectAnalyzer *)&returnCallersMap._M_h._M_single_bucket);
                    goto LAB_00aa8d5f;
                  }
                  ppEVar32 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                                       ((Iterator *)this_01);
                  uVar34 = ((*ppEVar32)->type).id;
                  if ((6 < uVar34 & (byte)uVar34) != 0) break;
                  uVar25 = (int)child + 1;
                  child = (Expression *)(ulong)uVar25;
                  pAVar50 = (AbstractChildIterator<wasm::ChildIterator> *)
                            target.super_IString.str._M_str;
                }
                std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
                ~_Vector_base(&local_f0);
              }
              std::__detail::
              _Insert_base<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)this_00,(value_type *)&local_50);
              EffectAnalyzer::~EffectAnalyzer
                        ((EffectAnalyzer *)&returnCallersMap._M_h._M_single_bucket);
            }
            EffectAnalyzer::visit((EffectAnalyzer *)auStack_298,(Expression *)local_50.wasm);
            pp_Var2 = &returnCallersMap._M_h._M_single_bucket;
            AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                      ((AbstractChildIterator<wasm::ChildIterator> *)pp_Var2,
                       (Expression *)local_50.wasm);
            __begin2_1.parent =
                 (ArenaVector<wasm::Expression_*> *)((ulong)__begin2_1.parent & 0xffffffff00000000);
            local_118 = (undefined1  [8])pp_Var2;
            IVar57 = AbstractChildIterator<wasm::ChildIterator>::end
                               ((AbstractChildIterator<wasm::ChildIterator> *)pp_Var2);
            IVar24 = (Index)__begin2_1.parent;
            while ((IVar24 != IVar57.index || (local_118 != (undefined1  [8])IVar57.parent))) {
              ppEVar32 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                                   ((Iterator *)local_118);
              target.super_IString.str._M_str = (char *)*ppEVar32;
              std::__detail::
              _Insert_base<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)this_00,(value_type *)this_01);
              IVar24 = (Index)__begin2_1.parent + 1;
              __begin2_1.parent =
                   (ArenaVector<wasm::Expression_*> *)CONCAT44(__begin2_1.parent._4_4_,IVar24);
            }
            std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
            ~_Vector_base(&local_560);
            goto LAB_00aa8d5f;
          }
          pp_Var9 = ((Pass *)&this_03->exports)->_vptr_Pass;
          pAVar1 = (ArenaVector<wasm::Expression_*> *)(pp_Var9 + 2);
          __begin2_1.parent = (ArenaVector<wasm::Expression_*> *)0x0;
          pAVar10 = (ArenaVector<wasm::Expression_*> *)pp_Var9[3];
          local_118 = (undefined1  [8])pAVar1;
          while ((__begin2_1.parent != pAVar10 || (local_118 != (undefined1  [8])pAVar1))) {
            ppEVar32 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       Iterator::operator*((Iterator *)local_118);
            pEVar11 = *ppEVar32;
            returnCallersMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
            returnCallersMap._M_h._M_single_bucket = (__node_base_ptr)operator_new(0x18);
            (returnCallersMap._M_h._M_single_bucket)->_M_nxt = (_Hash_node_base *)this_00;
            returnCallersMap._M_h._M_single_bucket[1]._M_nxt =
                 (_Hash_node_base *)
                 &nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
            returnCallersMap._M_h._M_single_bucket[2]._M_nxt = &local_d0;
            local_578 = 0;
            target.super_IString.str._M_str =
                 (char *)ExpressionManipulator::flexibleCopy
                                   (pEVar11,(Module *)curr,
                                    (CustomCopier *)&returnCallersMap._M_h._M_single_bucket);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
                       (Expression **)this_01);
            std::_Function_base::~_Function_base
                      ((_Function_base *)&returnCallersMap._M_h._M_single_bucket);
            __begin2_1.parent =
                 (ArenaVector<wasm::Expression_*> *)
                 ((long)&((__begin2_1.parent)->
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
                         .data + 1);
          }
          context.operands.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ =
               ((Pass *)&this_03->exports)->runner != (PassRunner *)0x0;
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)auStack_298);
          std::
          _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)this_00);
          ::anon_func::Lister::~Lister((Lister *)auStack_428);
          __k = (pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *)auStack_b8;
          std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>::
          pair<wasm::Name_&,_wasm::(anonymous_namespace)::CallContext_&,_true>
                    ((pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *)auStack_298,
                     (Name *)__k,(CallContext *)auStack_88);
          __c = std::__detail::
                _Hash_code_base<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::__detail::_Select1st,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                ::_M_hash_code((_Hash_code_base<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::__detail::_Select1st,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                *)auStack_298,__k);
          p_Var35 = std::
                    _Hashtable<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_find_node(&this_02->_M_h,__c % (this->funcContextMap)._M_h._M_bucket_count,
                                   (key_type *)auStack_298,__c);
          std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                    ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &nonMovingEffects.module);
          if (p_Var35 == (__node_ptr)0x0) {
            if ((char)context.operands.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
              if ((_func_int *)
                  ((long)context.operands.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 3) !=
                  pp_Var5[3]) {
                __assert_fail("operands.size() == call->operands.size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp"
                              ,0x202,
                              "bool wasm::(anonymous namespace)::CallContext::isTrivial(Call *, Module &)"
                             );
              }
              pFVar28 = Module::getFunction((Module *)curr,(Name)((IString *)(pp_Var5 + 6))->str);
              SVar58 = HeapType::getSignature(&pFVar28->type);
              auStack_298 = (undefined1  [8])SVar58.params.id.id;
              uVar25 = 0;
              do {
                uVar34 = (ulong)uVar25;
                if ((ulong)((long)context.operands.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 3)
                    <= uVar34) {
                  std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>::
                  pair<wasm::Name_&,_wasm::(anonymous_namespace)::CallContext_&,_true>
                            ((pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *)
                             auStack_298,(Name *)auStack_b8,(CallContext *)auStack_88);
                  pmVar47 = std::
                            unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                            ::operator[](this_02,(pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>
                                                  *)auStack_298);
                  (pmVar47->super_IString).str._M_len = (size_t)auStack_b8;
                  (pmVar47->super_IString).str._M_str = (char *)target.super_IString.str._M_len;
                  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                  ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 *)&nonMovingEffects.module);
                  goto LAB_00aa9835;
                }
                puVar12 = (&(((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               *)auStack_88)->
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)[uVar34];
                if (*(char *)&(puVar12->_M_t).
                              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl != '\b')
                break;
                pTVar36 = wasm::Type::operator[]((Type *)auStack_298,uVar34);
                uVar25 = uVar25 + 1;
              } while (puVar12[1]._M_t.
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                       super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl ==
                       (Export *)pTVar36->id);
            }
            ppEVar21 = context.operands.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            auVar31 = auStack_88;
            sVar37 = Function::getNumParams((Function *)local_40._M_nxt);
            out._M_nxt = local_40._M_nxt;
            if ((long)ppEVar21 - (long)auVar31 >> 3 != sVar37) {
              __assert_fail("context.operands.size() == func->getNumParams()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp"
                            ,0x301,
                            "std::unique_ptr<Function> wasm::(anonymous namespace)::Monomorphize::makeMonoFunctionWithContext(Function *, const CallContext &, Module &)"
                           );
            }
            NVar59 = Names::getValidFunctionName
                               ((Module *)curr,(IString)*(IString *)local_40._M_nxt);
            in_R8 = NVar59.super_IString.str._M_str;
            lister.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems
            [0].func._0_1_ = 0;
            newName.super_IString.str._M_str = NVar59.super_IString.str._M_len;
            newName.super_IString.str._M_len = (size_t)curr;
            in_R9 = (Module *)auStack_428;
            wasm::ModuleUtils::copyFunctionWithoutAdd
                      ((Function *)&stack0xffffffffffffffc8,(Module *)out._M_nxt,newName,in_R8,
                       (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       auStack_428);
            std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            _M_reset((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)local_118);
            std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            _M_reset((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)auStack_428);
            immovable._M_h._M_bucket_count = 0;
            lister.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            immovable._M_h._M_buckets = (__buckets_ptr)0x0;
            builder.wasm = (Module *)
                           context.operands.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            for (auVar31 = auStack_88; auVar31 != (undefined1  [8])builder.wasm;
                auVar31 = (undefined1  [8])
                          &(((Module *)auVar31)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
              FindAll<wasm::LocalGet>::FindAll
                        ((FindAll<wasm::LocalGet> *)auStack_298,
                         (Expression *)
                         (((Module *)auVar31)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              uVar19 = nonMovingEffects._0_8_;
              for (auVar55 = auStack_298; auVar55 != (undefined1  [8])uVar19;
                  auVar55 = (undefined1  [8])((long)auVar55 + 8)) {
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)this_00,
                           (value_type *)(*(long *)auVar55 + 8));
              }
              std::_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::~_Vector_base
                        ((_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                         auStack_298);
            }
            if ((char)context.operands.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
              SVar58 = HeapType::getSignature((HeapType *)(local_40._M_nxt + 7));
              TVar40 = SVar58.results.id;
            }
            else {
              TVar40.id = 0;
            }
            wasm::Type::Type((Type *)&local_d0,(Tuple *)this_00);
            SVar58.results.id = TVar40.id;
            SVar58.params.id = (uintptr_t)local_d0._M_nxt;
            HeapType::HeapType((HeapType *)auStack_298,SVar58);
            ((local_38._M_head_impl)->type).id = (uintptr_t)auStack_298;
            returnCallersMap._M_h._M_single_bucket =
                 (__node_base_ptr)&local_560._M_impl.super__Vector_impl_data._M_finish;
            local_578 = 0;
            local_560._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_560._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            SVar58 = HeapType::getSignature(&(local_38._M_head_impl)->type);
            auStack_298 = (undefined1  [8])SVar58.params.id.id;
            sVar37 = wasm::Type::size((Type *)auStack_298);
            SVar58 = HeapType::getSignature((HeapType *)(local_40._M_nxt + 7));
            target.super_IString.str._M_str = (char *)SVar58.params.id;
            sVar38 = wasm::Type::size((Type *)this_01);
            uVar25 = 0;
            while( true ) {
              auStack_298._0_4_ = uVar25;
              sVar39 = Function::getNumLocals((Function *)local_40._M_nxt);
              if (sVar39 <= uVar25) break;
              bVar23 = Function::isParam((Function *)local_40._M_nxt,auStack_298._0_4_);
              func._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
                   (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
                   (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
                   local_38._M_head_impl;
              uVar17 = auStack_298._0_4_;
              if (bVar23) {
                TVar40 = Function::getLocalType((Function *)local_40._M_nxt,auStack_298._0_4_);
                IVar24 = Builder::addVar((Function *)
                                         func._M_t.
                                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                         .super__Head_base<0UL,_wasm::Function_*,_false>.
                                         _M_head_impl,TVar40);
                pIVar41 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&returnCallersMap._M_h._M_single_bucket,
                                       (key_type *)auStack_298);
              }
              else {
                pIVar41 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&returnCallersMap._M_h._M_single_bucket,
                                       (key_type *)auStack_298);
                IVar24 = uVar17 + ((int)sVar37 - (int)sVar38);
              }
              *pIVar41 = IVar24;
              uVar25 = auStack_298._0_4_ + 1;
            }
            if (*(pointer *)(local_40._M_nxt + 0x10) != (pointer)0x0) {
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::clear(&((local_38._M_head_impl)->localNames)._M_h);
              std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::clear((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)((long)local_38._M_head_impl + 0xa0));
              uVar25 = 0;
              while( true ) {
                target.super_IString.str._M_str =
                     (char *)CONCAT44(target.super_IString.str._M_str._4_4_,uVar25);
                sVar37 = Function::getNumLocals((Function *)local_40._M_nxt);
                if (sVar37 <= uVar25) break;
                NVar59 = Function::getLocalNameOrDefault
                                   ((Function *)local_40._M_nxt,
                                    (Index)target.super_IString.str._M_str);
                if (NVar59.super_IString.str._M_str != (char *)0x0) {
                  pmVar42 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&returnCallersMap._M_h._M_single_bucket,
                                         (key_type *)this_01);
                  local_50.wasm._0_4_ = (float)*pmVar42;
                  _auStack_298 = (string_view)Names::getValidLocalName(local_38._M_head_impl,NVar59)
                  ;
                  pmVar43 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)((long)local_38._M_head_impl + 0x68),
                                         (key_type *)&local_50);
                  (pmVar43->super_IString).str._M_len = (size_t)auStack_298;
                  (pmVar43->super_IString).str._M_str = (char *)nonMovingEffects._0_8_;
                  fVar22 = local_50.wasm._0_4_;
                  pfVar44 = (float *)std::__detail::
                                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     ::operator[]((
                                                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)((long)local_38._M_head_impl + 0xa0),
                                                  (key_type *)auStack_298);
                  *pfVar44 = fVar22;
                }
                uVar25 = (Index)target.super_IString.str._M_str + 1;
              }
            }
            local_50.wasm = (Module *)curr;
            target.super_IString.str._M_str = (char *)0x0;
            for (local_8c = 0; p_Var20 = local_d8,
                (ulong)local_8c <
                (ulong)((long)context.operands.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 3);
                local_8c = local_8c + 1) {
              dst = (EVP_PKEY_CTX *)
                    (&(((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         *)auStack_88)->
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)[local_8c];
              pmVar42 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&returnCallersMap._M_h._M_single_bucket,&local_8c);
              IVar24 = *pmVar42;
              iVar26 = ExpressionManipulator::copy(dst,(EVP_PKEY_CTX *)curr);
              pLVar45 = Builder::makeLocalSet
                                  (&local_50,IVar24,(Expression *)CONCAT44(extraout_var,iVar26));
              auStack_298 = (undefined1  [8])pLVar45;
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)this_01,
                         (Expression **)auStack_298);
            }
            _auStack_298 = (string_view)ZEXT816(0);
            local_d8->_M_left = (_Base_ptr)0x0;
            p_Var20->_M_right = (_Base_ptr)0x0;
            *(_Base_ptr *)(p_Var20 + 1) = (_Base_ptr)0x0;
            *(undefined8 *)p_Var20 = 0;
            *(undefined8 *)&((_Rb_tree_header *)&p_Var20->_M_parent)->_M_header = 0;
            nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)&returnCallersMap._M_h._M_single_bucket;
            Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::pushTask
                      ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)auStack_298,
                       PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::scan,
                       (Expression **)((long)local_38._M_head_impl + 0x60));
            while( true ) {
              if ((nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                   _0_8_ - CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                                    nonMovingEffects.globalsWritten._M_t._M_impl._0_4_) >> 4) +
                  nonMovingEffects._0_8_ == 0) break;
              if (CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                           nonMovingEffects.globalsWritten._M_t._M_impl._0_4_) ==
                  nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                 ) {
                if (nonMovingEffects._0_8_ == 0) {
                  pcVar52 = 
                  "T &wasm::SmallVector<wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, 10>::back() [T = wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, N = 10]"
                  ;
                  goto LAB_00aa98db;
                }
                pcVar51 = *(code **)(auStack_298 + nonMovingEffects._0_8_ * 0x10);
                auStack_298 = *(undefined1 (*) [8])
                               (&nonMovingEffects.ignoreImplicitTraps +
                               nonMovingEffects._0_8_ * 0x10);
                nonMovingEffects._0_8_ = nonMovingEffects._0_8_ + -1;
              }
              else {
                pcVar51 = *(code **)(nonMovingEffects.globalsWritten._M_t._M_impl.
                                     super__Rb_tree_header._M_header._0_8_ + -0x10);
                auStack_298 = *(undefined1 (*) [8])
                               (nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header.
                                _M_header._0_8_ + -8);
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                     _0_8_ + -0x10;
              }
              if ((((ArenaVector<wasm::Expression_*> *)auStack_298)->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                  == (Expression **)0x0) {
                pcVar52 = 
                "void wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::walk(Expression *&) [SubType = LocalUpdater, VisitorType = wasm::Visitor<LocalUpdater>]"
                ;
                goto LAB_00aa98bc;
              }
              (*pcVar51)((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)auStack_298);
            }
            if (target.super_IString.str._M_str != (char *)0x0) {
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_01,
                         &(local_38._M_head_impl)->body);
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)extraout_RDX;
              pBVar46 = Builder::
                        makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                  (&local_50,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)this_01,type);
              (local_38._M_head_impl)->body = (Expression *)pBVar46;
            }
            if ((char)context.operands.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
              ReturnUtils::removeReturns(local_38._M_head_impl,(Module *)curr);
            }
            Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::~Walker
                      ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)auStack_298);
            std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
            ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          this_01);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&returnCallersMap._M_h._M_single_bucket);
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                      ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)this_00);
            sVar37 = Function::getNumParams(local_38._M_head_impl);
            if (sVar37 < 0x14) {
              if (this->onlyWhenHelpful == true) {
                doOpts(this,(Function *)local_40._M_nxt);
                CostAnalyzer::CostAnalyzer
                          ((CostAnalyzer *)auStack_298,
                           (Expression *)
                           (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                              *)(local_40._M_nxt + 0xc))->
                           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
                ppEVar21 = context.operands.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                local_40._M_nxt = (_Hash_node_base *)(double)(uint)auStack_298._0_4_;
                for (auVar31 = auStack_88; auVar31 != (undefined1  [8])ppEVar21;
                    auVar31 = (undefined1  [8])
                              &(((Module *)auVar31)->exports).
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish) {
                  CostAnalyzer::CostAnalyzer
                            ((CostAnalyzer *)auStack_298,
                             (Expression *)
                             (((Module *)auVar31)->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
                  local_40._M_nxt =
                       (_Hash_node_base *)(local_40._M_nxt + (double)(uint)auStack_298._0_4_);
                }
                if (((double)local_40._M_nxt != 0.0) || (NAN((double)local_40._M_nxt))) {
                  doOpts(this,local_38._M_head_impl);
                  CostAnalyzer::CostAnalyzer
                            ((CostAnalyzer *)auStack_298,
                             *(Expression **)((long)local_38._M_head_impl + 0x60));
                  if ((double)wasm::(anonymous_namespace)::MinPercentBenefit <
                      100.0 - ((double)(uint)auStack_298._0_4_ * 100.0) / (double)local_40._M_nxt)
                  goto LAB_00aa9761;
                }
                bVar23 = false;
                _Var54._M_head_impl = (Function *)auStack_b8;
              }
              else {
LAB_00aa9761:
                bVar23 = true;
                _Var54._M_head_impl = local_38._M_head_impl;
              }
              std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>::
              pair<wasm::Name_&,_wasm::(anonymous_namespace)::CallContext_&,_true>
                        ((pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *)auStack_298,
                         (Name *)auStack_b8,(CallContext *)auStack_88);
              pmVar47 = std::
                        unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                        ::operator[](this_02,(pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>
                                              *)auStack_298);
              pcVar52 = ((_Var54._M_head_impl)->super_Importable).super_Named.name.super_IString.str
                        ._M_str;
              (pmVar47->super_IString).str._M_len =
                   ((_Var54._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                   _M_len;
              (pmVar47->super_IString).str._M_str = pcVar52;
              std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
              ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *
                            )&nonMovingEffects.module);
              if (bVar23) {
                newTarget_00.super_IString.str._M_str =
                     (char *)&nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
                newTarget_00.super_IString.str._M_len =
                     (size_t)((local_38._M_head_impl)->super_Importable).super_Named.name.
                             super_IString.str._M_str;
                updateCall((Monomorphize *)this_03,
                           (CallInfo *)
                           ((local_38._M_head_impl)->super_Importable).super_Named.name.
                           super_IString.str._M_len,newTarget_00,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)in_R8,
                           in_R9);
                Module::addFunction((Module *)curr,
                                    (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                     *)&stack0xffffffffffffffc8);
              }
            }
            std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                      ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                       &stack0xffffffffffffffc8);
          }
          else {
            p_Var8 = *(_func_int **)
                      ((long)&(p_Var35->
                              super__Hash_node_value<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>
                              ._M_storage._M_storage + 0x38);
            if (p_Var8 != p_Var13) {
              newTarget.super_IString.str._M_str =
                   (char *)&nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count;
              newTarget.super_IString.str._M_len = (size_t)p_Var8;
              updateCall((Monomorphize *)this_03,
                         *(CallInfo **)
                          ((long)&(p_Var35->
                                  super__Hash_node_value<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>
                                  ._M_storage._M_storage + 0x30),newTarget,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)in_R8,
                         in_R9);
            }
          }
LAB_00aa9835:
          std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                    ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
          std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                    ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     auStack_88);
        }
      }
      this_03 = (Module *)&((Pass *)&this_03->exports)->name;
    }
    CallFinder::~CallFinder((CallFinder *)auStack_6b8);
    auVar48 = (undefined1  [8])((long)auVar48 + 0x10);
  } while( true );
}

Assistant:

void run(Module* module) override {
    // TODO: parallelize, see comments below

    applyArguments();

    // Find all the return-calling functions. We cannot remove their returns
    // (because turning a return call into a normal call may break the program
    // by using more stack).
    auto returnCallersMap = ReturnUtils::findReturnCallers(*module);

    // Note the list of all functions. We'll be adding more, and do not want to
    // operate on those.
    std::vector<Name> funcNames;
    ModuleUtils::iterDefinedFunctions(
      *module, [&](Function* func) { funcNames.push_back(func->name); });

    // Find the calls in each function and optimize where we can, changing them
    // to call the monomorphized targets.
    for (auto name : funcNames) {
      auto* func = module->getFunction(name);

      CallFinder callFinder;
      callFinder.walk(func->body);
      for (auto& info : callFinder.infos) {
        if (info.call->type == Type::unreachable) {
          // Ignore unreachable code.
          // TODO: return_call?
          continue;
        }

        if (info.call->target == name) {
          // Avoid recursion, which adds some complexity (as we'd be modifying
          // ourselves if we apply optimizations).
          continue;
        }

        // If the target function does a return call, then as noted earlier we
        // cannot remove its returns, so do not consider the drop as part of the
        // context in such cases (as if we reverse-inlined the drop into the
        // target then we'd be removing the returns).
        if (returnCallersMap[module->getFunction(info.call->target)]) {
          info.drop = nullptr;
        }

        processCall(info, *module);
      }
    }
  }